

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O0

void sysbvm_sourceCode_computeLineAndColumnForIndex
               (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t index,
               uint32_t *outLine,uint32_t *outColumn)

{
  uint32_t uVar1;
  uint32_t uVar2;
  sysbvm_tuple_t array;
  size_t index_00;
  sysbvm_tuple_t tuple;
  ulong uVar3;
  size_t column;
  size_t line;
  size_t middleIndex;
  size_t middle;
  size_t bestIndexSoFar;
  size_t bestSoFar;
  size_t right;
  size_t left;
  size_t indexValue;
  size_t indexTableSize;
  sysbvm_tuple_t indexTable;
  uint32_t *outColumn_local;
  uint32_t *outLine_local;
  sysbvm_tuple_t index_local;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_context_t *context_local;
  
  array = sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt(context,sourceCode);
  bestSoFar = sysbvm_array_getSize(array);
  uVar1 = sysbvm_tuple_uint32_decode(index);
  right = 0;
  bestIndexSoFar = 0;
  middle = 0;
  while (right < bestSoFar) {
    index_00 = right + (bestSoFar - right >> 1);
    tuple = sysbvm_array_at(array,index_00);
    uVar2 = sysbvm_tuple_uint32_decode(tuple);
    uVar3 = (ulong)uVar2;
    if (uVar1 < uVar3) {
      if (uVar1 < uVar3) {
        bestSoFar = index_00;
      }
    }
    else {
      right = index_00 + 1;
      middle = uVar3;
      bestIndexSoFar = index_00;
    }
  }
  if (outLine != (uint32_t *)0x0) {
    *outLine = (int)bestIndexSoFar + 1;
  }
  if (outColumn != (uint32_t *)0x0) {
    *outColumn = (uVar1 - (int)middle) + 1;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_sourceCode_computeLineAndColumnForIndex(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t index, uint32_t *outLine, uint32_t *outColumn)
{
    // Make sure the line start index table is built.
    sysbvm_tuple_t indexTable = sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt(context, sourceCode);

    // Perform a binary search.
    size_t indexTableSize = sysbvm_array_getSize(indexTable);
    size_t indexValue = sysbvm_tuple_uint32_decode(index);

    size_t left = 0;
    size_t right = indexTableSize;
    size_t bestSoFar = 0;
    size_t bestIndexSoFar = 0;
    while(left < right)
    {
        size_t middle = left + (right - left) / 2;
        size_t middleIndex = sysbvm_tuple_uint32_decode(sysbvm_array_at(indexTable, middle));
        if(middleIndex <= indexValue)
        {
            bestSoFar = middle;
            bestIndexSoFar = middleIndex;
            left = middle + 1;
        }
        else if(middleIndex > indexValue)
        {
            right = middle;
        }
    }

    size_t line = bestSoFar + 1;
    size_t column = indexValue - bestIndexSoFar + 1;

    // Emit the result.
    if(outLine)
        *outLine = line;
    if(outColumn)
        *outColumn = column;
}